

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::csharp::TryRemovePrefix_abi_cxx11_
          (string *__return_storage_ptr__,csharp *this,string_view prefix,string_view value)

{
  string *this_00;
  char *pcVar1;
  ulong uVar2;
  char *pcVar3;
  char *__pos;
  char *pcVar4;
  size_t i;
  csharp *pcVar5;
  allocator<char> local_81;
  string *local_80;
  string_view value_local;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  char *local_58;
  string prefix_to_match;
  
  pcVar4 = (char *)value._M_len;
  value_local._M_len = (size_t)prefix._M_str;
  local_80 = __return_storage_ptr__;
  value_local._M_str = pcVar4;
  local_58 = (char *)value_local._M_len;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&prefix_to_match,"",(allocator<char> *)&local_68);
  for (pcVar5 = (csharp *)0x0; this_00 = local_80, this != pcVar5; pcVar5 = pcVar5 + 1) {
    if (pcVar5[prefix._M_len] != (csharp)0x5f) {
      std::__cxx11::string::push_back((char)&prefix_to_match);
    }
  }
  uVar2 = 0;
  pcVar1 = (char *)0x0;
  do {
    if (prefix_to_match._M_string_length <= uVar2) {
      pcVar3 = pcVar1;
      if (pcVar1 < local_58) {
        pcVar3 = local_58;
      }
      for (; (__pos = pcVar3, pcVar3 != pcVar1 && (__pos = pcVar1, pcVar4[(long)pcVar1] == '_'));
          pcVar1 = pcVar1 + 1) {
      }
      if (__pos == local_58) {
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)local_80,&value_local,(allocator<char> *)&local_68);
      }
      else {
        local_68 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                             (&value_local,(size_type)__pos,0xffffffffffffffff);
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)this_00,&local_68,&local_81);
      }
LAB_001f3703:
      std::__cxx11::string::~string((string *)&prefix_to_match);
      return this_00;
    }
    if (local_58 == pcVar1) {
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)local_80,&value_local,(allocator<char> *)&local_68);
      goto LAB_001f3703;
    }
    if ((ulong)(byte)pcVar4[(long)pcVar1] != 0x5f) {
      if (*(char *)((long)&absl::lts_20240722::ascii_internal::kToLower +
                   (ulong)(byte)pcVar4[(long)pcVar1]) != prefix_to_match._M_dataplus._M_p[uVar2]) {
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)local_80,&value_local,(allocator<char> *)&local_68);
        goto LAB_001f3703;
      }
      uVar2 = uVar2 + 1;
    }
    pcVar1 = pcVar1 + 1;
  } while( true );
}

Assistant:

std::string TryRemovePrefix(absl::string_view prefix, absl::string_view value) {
  // First normalize to a lower-case no-underscores prefix to match against
  std::string prefix_to_match = "";
  for (size_t i = 0; i < prefix.size(); i++) {
    if (prefix[i] != '_') {
      prefix_to_match += absl::ascii_tolower(prefix[i]);
    }
  }

  // This keeps track of how much of value we've consumed
  size_t prefix_index, value_index;
  for (prefix_index = 0, value_index = 0;
       prefix_index < prefix_to_match.size() && value_index < value.size();
       value_index++) {
    // Skip over underscores in the value
    if (value[value_index] == '_') {
      continue;
    }
    if (absl::ascii_tolower(value[value_index]) !=
        prefix_to_match[prefix_index++]) {
      // Failed to match the prefix - bail out early.
      return std::string(value);
    }
  }

  // If we didn't finish looking through the prefix, we can't strip it.
  if (prefix_index < prefix_to_match.size()) {
    return std::string(value);
  }

  // Step over any underscores after the prefix
  while (value_index < value.size() && value[value_index] == '_') {
    value_index++;
  }

  // If there's nothing left (e.g. it was a prefix with only underscores
  // afterwards), don't strip.
  if (value_index == value.size()) {
    return std::string(value);
  }

  return std::string(value.substr(value_index));
}